

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

int ImParseFormatPrecision(char *fmt,int default_precision)

{
  char cVar1;
  byte bVar2;
  char *in_RCX;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte bVar11;
  
  do {
    cVar1 = *fmt;
    if (cVar1 == '\0') {
      iVar4 = 3;
      pcVar3 = in_RCX;
    }
    else if ((cVar1 != '%') || (iVar4 = 1, pcVar3 = fmt, fmt[1] == '%')) {
      fmt = fmt + (ulong)(cVar1 == '%') + 1;
      iVar4 = 0;
      pcVar3 = in_RCX;
    }
    in_RCX = pcVar3;
  } while (iVar4 == 0);
  if (iVar4 == 1) {
    fmt = pcVar3;
  }
  if (*fmt == '%') {
    pbVar9 = (byte *)(fmt + 1);
    do {
      pbVar10 = pbVar9;
      pbVar9 = pbVar10 + 1;
    } while ((byte)(*pbVar10 - 0x30) < 10);
    if (*pbVar10 == 0x2e) {
      bVar2 = *pbVar9;
      uVar8 = (ulong)(bVar2 == 0x2d);
      lVar6 = (pbVar9[uVar8] == 0x2b) + uVar8;
      bVar11 = pbVar9[lVar6];
      if ((byte)(bVar11 - 0x30) < 10) {
        uVar7 = 0;
        do {
          uVar7 = (uint)(byte)(bVar11 - 0x30) + uVar7 * 10;
          bVar11 = pbVar9[lVar6 + 1];
          pbVar9 = pbVar9 + 1;
        } while ((byte)(bVar11 - 0x30) < 10);
      }
      else {
        uVar7 = 0;
      }
      pbVar10 = pbVar9 + lVar6;
      uVar5 = -uVar7;
      if (bVar2 != 0x2d) {
        uVar5 = uVar7;
      }
      if (99 < uVar5) {
        uVar5 = default_precision;
      }
    }
    else {
      uVar5 = 0x7fffffff;
    }
    bVar2 = *pbVar10;
    if ((bVar2 | 0x20) == 0x65) {
      uVar5 = 0xffffffff;
    }
    if (((bVar2 == 0x67) || (bVar2 == 0x47)) && (uVar5 == 0x7fffffff)) {
      uVar5 = 0xffffffff;
    }
    if (uVar5 != 0x7fffffff) {
      default_precision = uVar5;
    }
  }
  return default_precision;
}

Assistant:

int ImParseFormatPrecision(const char* fmt, int default_precision)
{
    fmt = ImParseFormatFindStart(fmt);
    if (fmt[0] != '%')
        return default_precision;
    fmt++;
    while (*fmt >= '0' && *fmt <= '9')
        fmt++;
    int precision = INT_MAX;
    if (*fmt == '.')
    {
        fmt = ImAtoi<int>(fmt + 1, &precision);
        if (precision < 0 || precision > 99)
            precision = default_precision;
    }
    if (*fmt == 'e' || *fmt == 'E') // Maximum precision with scientific notation
        precision = -1;
    if ((*fmt == 'g' || *fmt == 'G') && precision == INT_MAX)
        precision = -1;
    return (precision == INT_MAX) ? default_precision : precision;
}